

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O0

void test_bson_json_read_dbpointer(void)

{
  char *pcVar1;
  char **p;
  char *invalid [9];
  _Bool r;
  bson_error_t error;
  bson_t b;
  long *local_3d8;
  long local_3d0 [9];
  byte local_381;
  uint local_380;
  uint local_37c;
  char acStack_378 [504];
  undefined1 local_180 [376];
  
  memcpy(local_3d0,&PTR_anon_var_dwarf_c7f9_001622f0,0x48);
  local_3d8 = local_3d0;
  while( true ) {
    if (*local_3d8 == 0) {
      return;
    }
    local_381 = bson_init_from_json(local_180,*local_3d8,0xffffffffffffffff,&local_380);
    local_381 = local_381 & 1;
    if (((local_381 ^ 0xff) & 1) == 0) {
      fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c"
              ,0x455,"test_bson_json_read_dbpointer","!r");
      abort();
    }
    if (local_380 != 1) {
      fprintf(_stderr,"FAIL\n\nAssert Failure: %d %s %d\n%s:%d  %s()\n",(ulong)local_380,"==",1,
              "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c"
              ,0x457,"test_bson_json_read_dbpointer");
      abort();
    }
    if (local_37c != 2) break;
    pcVar1 = strstr(acStack_378,(char *)local_3d8[1]);
    if (pcVar1 == (char *)0x0) {
      fprintf(_stderr,"FAIL\n\nAssert Failure: \"%s\" does not contain \"%s\"\n",acStack_378,
              local_3d8[1]);
      abort();
    }
    bson_destroy(local_180);
    local_3d8 = local_3d8 + 2;
  }
  fprintf(_stderr,"FAIL\n\nAssert Failure: %d %s %d\n%s:%d  %s()\n",(ulong)local_37c,"==",2,
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
          0x457,"test_bson_json_read_dbpointer");
  abort();
}

Assistant:

static void
test_bson_json_read_dbpointer (void)
{
   bson_t b;
   bson_error_t error;
   bool r;

   /* must have both $ref and $id, $id must be ObjectId */
   const char *invalid[] = {
      "{\"p\": {\"$dbPointer\": {\"$ref\": \"db.collection\"}}",
      "$dbPointer requires both $id and $ref",

      "{\"p\": {\"$dbPointer\": {\"$ref\": \"db.collection\", \"$id\": 1}}",
      "$dbPointer.$id must be like {\"$oid\": ...\"}",

      "{\"p\": {\"$dbPointer\": {\"$id\": {"
      "\"$oid\": \"57e193d7a9cc81b4027498b1\"}}}}",
      "$dbPointer requires both $id and $ref",

      "{\"p\": {\"$dbPointer\": {}}}",
      "Empty $dbPointer",

      NULL};

   const char **p;

   for (p = invalid; *p; p += 2) {
      r = bson_init_from_json (&b, *p, -1, &error);
      BSON_ASSERT (!r);
      ASSERT_ERROR_CONTAINS (
         error, BSON_ERROR_JSON, BSON_JSON_ERROR_READ_INVALID_PARAM, *(p + 1));

      bson_destroy (&b);
   }
}